

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::anon_unknown_15::translateActiveException(void)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *this;
  reference ppIVar4;
  ContextOptions *pCVar5;
  undefined7 uVar6;
  String *in_RDI;
  AssertData *ad;
  byte bStack_152;
  byte bStack_151;
  byte bStack_141;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  _Stack_130;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  _Stack_128;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *pvStack_120;
  String SStack_118;
  String SStack_f0;
  String SStack_d8;
  String SStack_c0;
  AssertData *pAStack_a8;
  undefined1 *puStack_a0;
  undefined1 local_89;
  String *local_88;
  String *local_80;
  exception *ex;
  string *msg;
  char *msg_1;
  reference local_50;
  IExceptionTranslator **curr;
  iterator __end2;
  iterator __begin2;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *__range2;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *translators;
  String res;
  
  puStack_a0 = (undefined1 *)0x110b03;
  local_88 = in_RDI;
  local_80 = in_RDI;
  String::String((String *)&translators);
  puStack_a0 = (undefined1 *)0x110b08;
  this = getExceptionTranslators();
  puStack_a0 = (undefined1 *)0x110b1d;
  __end2 = std::
           vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
           ::begin(this);
  puStack_a0 = (undefined1 *)0x110b2a;
  curr = (IExceptionTranslator **)
         std::
         vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
         ::end(this);
  while( true ) {
    ad = (AssertData *)&__end2;
    puStack_a0 = (undefined1 *)0x110b3b;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                        *)ad,(__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                              *)&curr);
    if (!bVar1) {
      puStack_a0 = (undefined1 *)0x110bb2;
      __cxa_rethrow();
      pAStack_a8 = ad;
      if ((ad->m_at & is_throws) == 0) {
        if (((ad->m_at & is_throws_as) == 0) || ((ad->m_at & is_throws_with) == 0)) {
          if ((ad->m_at & is_throws_as) == 0) {
            if ((ad->m_at & is_throws_with) == 0) {
              puStack_a0 = &stack0xfffffffffffffff8;
              if ((ad->m_at & is_nothrow) != 0) {
                puStack_a0 = &stack0xfffffffffffffff8;
                ad->m_failed = (bool)(ad->m_threw & 1);
              }
            }
            else {
              puStack_a0 = &stack0xfffffffffffffff8;
              bVar1 = AssertData::StringContains::check(&ad->m_exception_string,&ad->m_exception);
              ad->m_failed = (bool)((bVar1 ^ 0xffU) & 1);
            }
          }
          else {
            puStack_a0 = &stack0xfffffffffffffff8;
            ad->m_failed = (bool)((ad->m_threw_as ^ 0xffU) & 1);
          }
        }
        else {
          bStack_141 = 1;
          puStack_a0 = &stack0xfffffffffffffff8;
          if ((ad->m_threw_as & 1U) != 0) {
            puStack_a0 = &stack0xfffffffffffffff8;
            bVar1 = AssertData::StringContains::check(&ad->m_exception_string,&ad->m_exception);
            bStack_141 = bVar1 ^ 0xff;
          }
          ad->m_failed = (bool)(bStack_141 & 1);
        }
      }
      else {
        puStack_a0 = &stack0xfffffffffffffff8;
        ad->m_failed = (bool)((ad->m_threw ^ 0xffU) & 1);
      }
      sVar3 = String::size(&ad->m_exception);
      if (sVar3 != 0) {
        String::String(&SStack_f0,"\"");
        operator+(&SStack_d8,&SStack_f0,&ad->m_exception);
        String::String(&SStack_118,"\"");
        operator+(&SStack_c0,&SStack_d8,&SStack_118);
        String::operator=(&ad->m_exception,&SStack_c0);
        String::~String(&SStack_c0);
        String::~String(&SStack_118);
        String::~String(&SStack_d8);
        String::~String(&SStack_f0);
      }
      if ((is_running_in_test & 1) == 0) {
        if ((ad->m_failed & 1U) != 0) {
          detail::failed_out_of_a_testing_context(ad);
        }
      }
      else {
        addAssert(ad->m_at);
        pvStack_120 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                      (detail::g_cs + 0x10d0);
        _Stack_128._M_current =
             (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                       (pvStack_120);
        _Stack_130._M_current =
             (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                       (pvStack_120);
        while (bVar1 = __gnu_cxx::operator!=(&_Stack_128,&_Stack_130), bVar1) {
          ppIVar4 = __gnu_cxx::
                    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                    ::operator*(&_Stack_128);
          (*(*ppIVar4)->_vptr_IReporter[9])(*ppIVar4,ad);
          __gnu_cxx::
          __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
          ::operator++(&_Stack_128);
        }
        if ((ad->m_failed & 1U) != 0) {
          addFailedAssert(ad->m_at);
        }
      }
      uVar6 = 0;
      bStack_151 = 0;
      if ((ad->m_failed & 1U) != 0) {
        bVar1 = detail::isDebuggerActive();
        uVar6 = 0;
        bStack_151 = 0;
        if (bVar1) {
          pCVar5 = getContextOptions();
          uVar6 = 0;
          bStack_151 = 0;
          if ((pCVar5->no_breaks & 1U) == 0) {
            uVar6 = 0;
            bStack_152 = 1;
            if (*(long *)(detail::g_cs + 0x20) != 0) {
              uVar6 = (undefined7)((ulong)*(long *)(detail::g_cs + 0x20) >> 8);
              bStack_152 = *(byte *)(*(long *)(detail::g_cs + 0x20) + 0x39) ^ 0xff;
            }
            bStack_151 = bStack_152;
          }
        }
      }
      return (String *)(CONCAT71(uVar6,bStack_151) & 0xffffffffffffff01);
    }
    puStack_a0 = (undefined1 *)0x110b4a;
    local_50 = __gnu_cxx::
               __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
               ::operator*(&__end2);
    puStack_a0 = (undefined1 *)0x110b62;
    uVar2 = (*(*local_50)->_vptr_IExceptionTranslator[2])(*local_50,&translators);
    local_89 = (undefined1)uVar2;
    if ((uVar2 & 1) != 0) break;
    puStack_a0 = (undefined1 *)0x110bab;
    __gnu_cxx::
    __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
    ::operator++(&__end2);
  }
  puStack_a0 = (undefined1 *)0x110b83;
  String::String(local_88,(String *)&translators);
  msg_1._0_4_ = 1;
  puStack_a0 = (undefined1 *)0x110d18;
  String::~String((String *)&translators);
  return local_80;
}

Assistant:

String translateActiveException() {
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        String res;
        auto&  translators = getExceptionTranslators();
        for(auto& curr : translators)
            if(curr->translate(res))
                return res;
        // clang-format off
        DOCTEST_GCC_SUPPRESS_WARNING_WITH_PUSH("-Wcatch-value")
        try {
            throw;
        } catch(std::exception& ex) {
            return ex.what();
        } catch(std::string& msg) {
            return msg.c_str();
        } catch(const char* msg) {
            return msg;
        } catch(...) {
            return "unknown exception";
        }
        DOCTEST_GCC_SUPPRESS_WARNING_POP
// clang-format on
#else  // DOCTEST_CONFIG_NO_EXCEPTIONS
        return "";
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
    }